

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

void __thiscall Game::buyCardsComputer(Game *this,Player *player)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pCVar4;
  ostream *this_00;
  Cards local_220;
  Cards local_1b0;
  Cards local_140;
  undefined1 local_c0 [8];
  Cards card;
  __normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_> local_48;
  iterator __end1;
  iterator __begin1;
  vector<Cards,_std::allocator<Cards>_> *__range1;
  Player *player_local;
  Game *this_local;
  
  DeckOfCards::topThreeCards((vector<Cards,_std::allocator<Cards>_> *)&__begin1,&this->deckOfCards);
  __end1 = std::vector<Cards,_std::allocator<Cards>_>::begin
                     ((vector<Cards,_std::allocator<Cards>_> *)&__begin1);
  local_48._M_current =
       (Cards *)std::vector<Cards,_std::allocator<Cards>_>::end
                          ((vector<Cards,_std::allocator<Cards>_> *)&__begin1);
  bVar1 = __gnu_cxx::operator!=(&__end1,&local_48);
  if (bVar1) {
    pCVar4 = __gnu_cxx::__normal_iterator<Cards_*,_std::vector<Cards,_std::allocator<Cards>_>_>::
             operator*(&__end1);
    Cards::Cards((Cards *)local_c0,pCVar4);
    iVar2 = Cards::getEnergyCost((Cards *)local_c0);
    iVar3 = Player::getEnergyCubes(player);
    if (iVar2 < iVar3) {
      Cards::Cards(&local_1b0,(Cards *)local_c0);
      DeckOfCards::draw(&local_140,&this->deckOfCards,&local_1b0);
      Cards::~Cards(&local_140);
      Cards::~Cards(&local_1b0);
      Cards::Cards(&local_220,(Cards *)local_c0);
      Player::buyCards(player,&local_220);
      Cards::~Cards(&local_220);
    }
    else {
      this_00 = std::operator<<((ostream *)&std::cout,"Cannot afford any cards");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
    card.it._M_current._4_4_ = 1;
    Cards::~Cards((Cards *)local_c0);
  }
  else {
    card.it._M_current._4_4_ = 2;
  }
  std::vector<Cards,_std::allocator<Cards>_>::~vector
            ((vector<Cards,_std::allocator<Cards>_> *)&__begin1);
  return;
}

Assistant:

void Game::buyCardsComputer(Player* player) {
    for(Cards card: deckOfCards.topThreeCards()) {
        if(card.getEnergyCost() < player->getEnergyCubes()){
            deckOfCards.draw(card);
            player->buyCards(card);
            return;
        }
        else{
            cout << "Cannot afford any cards" << endl;
            return;
        }
    }
}